

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_Sum(SumForm1 Sum,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  TimerContainer timer;
  Image image;
  ImageTemplate<unsigned_char> local_80;
  Image local_58;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,size,size,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)&local_80);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)&local_80);
    (*Sum)(&local_58);
    Performance_Test::TimerContainer::stop((TimerContainer *)&local_80);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean((BaseTimerContainer *)&local_80);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  return pVar3;
}

Assistant:

std::pair < double, double > template_Sum( SumForm1 Sum, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );

        TEST_FUNCTION_LOOP( Sum( image ), namespaceName )
    }